

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

void __thiscall cashew::JSPrinter::safeSpace(JSPrinter *this)

{
  size_t sVar1;
  
  if (this->pretty == true) {
    maybeSpace(this,' ');
    ensure(this,1);
    sVar1 = this->used;
    this->used = sVar1 + 1;
    this->buffer[sVar1] = ' ';
  }
  else {
    this->possibleSpace = true;
  }
  return;
}

Assistant:

void safeSpace() {
    if (pretty) {
      emit(' ');
    } else {
      possibleSpace = true;
    }
  }